

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O1

int memory_free_x86_64(uc_struct_conflict *uc)

{
  MemoryRegion *pMVar1;
  MemoryRegion *subregion;
  
  subregion = (uc->system_memory->subregions).tqh_first;
  while (subregion != (MemoryRegion *)0x0) {
    pMVar1 = (subregion->subregions_link).tqe_next;
    subregion->enabled = false;
    memory_region_del_subregion_x86_64(uc->system_memory,subregion);
    (*subregion->destructor)(subregion);
    g_free(subregion);
    subregion = pMVar1;
  }
  return 0;
}

Assistant:

int memory_free(struct uc_struct *uc)
{
    MemoryRegion *subregion, *subregion_next;
    MemoryRegion *mr = uc->system_memory;

    QTAILQ_FOREACH_SAFE(subregion, &mr->subregions, subregions_link, subregion_next) {
        subregion->enabled = false;
        memory_region_del_subregion(uc->system_memory, subregion);
        subregion->destructor(subregion);
        /* destroy subregion */
        g_free(subregion);
    }

    return 0;
}